

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

float refineBySAT(Abc_Ntk_t *pNtk1,Vec_Int_t **iMatch1,int *iGroup1,Vec_Int_t **iDep1,
                 int *iLastItem1,Vec_Int_t **oMatch1,int *oGroup1,Vec_Int_t **oDep1,int *oLastItem1,
                 int *observability1,Abc_Ntk_t *pNtk2,Vec_Int_t **iMatch2,int *iGroup2,
                 Vec_Int_t **iDep2,int *iLastItem2,Vec_Int_t **oMatch2,int *oGroup2,
                 Vec_Int_t **oDep2,int *oLastItem2,int *observability2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Int_t *iNonSingleton;
  Vec_Int_t *matchedInputs1;
  Vec_Int_t *matchedInputs2;
  Vec_Int_t *matchedOutputs1;
  Vec_Int_t *matchedOutputs2;
  Vec_Ptr_t **nodesInLevel1;
  Vec_Ptr_t *pVVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t **nodesInLevel2;
  Vec_Int_t *oMatchedGroups;
  Vec_Int_t *pVVar8;
  Abc_Ntk_t *subNtk1;
  Abc_Ntk_t *subNtk2;
  abctime aVar9;
  FILE *__stream;
  char *pcVar10;
  char *pcVar11;
  int i;
  long lVar12;
  bool bVar13;
  
  aVar5 = Abc_Clock();
  iNonSingleton = Vec_IntAlloc(10);
  matchedInputs1 = Vec_IntAlloc(pNtk1->vPis->nSize);
  matchedInputs2 = Vec_IntAlloc(pNtk2->vPis->nSize);
  matchedOutputs1 = Vec_IntAlloc(pNtk1->vPos->nSize);
  matchedOutputs2 = Vec_IntAlloc(pNtk2->vPos->nSize);
  iVar1 = Abc_AigLevel(pNtk1);
  nodesInLevel1 = (Vec_Ptr_t **)malloc((long)iVar1 * 8 + 8);
  for (lVar12 = 0; iVar1 = Abc_AigLevel(pNtk1), lVar12 <= iVar1; lVar12 = lVar12 + 1) {
    pVVar6 = Vec_PtrAlloc(0x14);
    nodesInLevel1[lVar12] = pVVar6;
  }
  for (iVar1 = 0; iVar1 < pNtk1->vObjs->nSize; iVar1 = iVar1 + 1) {
    pAVar7 = Abc_NtkObj(pNtk1,iVar1);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar7), iVar2 != 0)) {
      Vec_PtrPush(nodesInLevel1[*(uint *)&pAVar7->field_0x14 >> 0xc],pAVar7);
    }
  }
  iVar1 = Abc_AigLevel(pNtk2);
  nodesInLevel2 = (Vec_Ptr_t **)malloc((long)iVar1 * 8 + 8);
  for (lVar12 = 0; iVar1 = Abc_AigLevel(pNtk2), lVar12 <= iVar1; lVar12 = lVar12 + 1) {
    pVVar6 = Vec_PtrAlloc(0x14);
    nodesInLevel2[lVar12] = pVVar6;
  }
  for (iVar1 = 0; iVar1 < pNtk2->vObjs->nSize; iVar1 = iVar1 + 1) {
    pAVar7 = Abc_NtkObj(pNtk2,iVar1);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar7), iVar2 != 0)) {
      Vec_PtrPush(nodesInLevel2[*(uint *)&pAVar7->field_0x14 >> 0xc],pAVar7);
    }
  }
  oMatchedGroups = Vec_IntAlloc(10);
  for (lVar12 = 0; lVar12 < *iLastItem1; lVar12 = lVar12 + 1) {
    if (iMatch1[lVar12]->nSize == 1) {
      iVar1 = Vec_IntEntryLast(iMatch1[lVar12]);
      Vec_IntPush(matchedInputs1,iVar1);
      iVar1 = Vec_IntEntryLast(iMatch2[lVar12]);
      pVVar8 = matchedInputs2;
    }
    else {
      iVar1 = (int)lVar12;
      pVVar8 = iNonSingleton;
    }
    Vec_IntPush(pVVar8,iVar1);
  }
  for (lVar12 = 0; lVar12 < *oLastItem1; lVar12 = lVar12 + 1) {
    if (oMatch1[lVar12]->nSize == 1) {
      iVar1 = Vec_IntEntryLast(oMatch1[lVar12]);
      Vec_IntPush(matchedOutputs1,iVar1);
      iVar1 = Vec_IntEntryLast(oMatch2[lVar12]);
      Vec_IntPush(matchedOutputs2,iVar1);
    }
  }
  iVar1 = iNonSingleton->nSize;
  iVar2 = 0;
  do {
    iVar4 = iVar2;
    if (iVar1 + -1 <= iVar4) {
      iVar1 = match1by1(pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                        pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                        matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,0,0);
      if (iVar1 == 0) {
        bVar13 = true;
      }
      else if (matchedOutputs1->nSize == pNtk1->vPos->nSize) {
        bVar13 = false;
      }
      else {
        pVVar8 = Vec_IntAlloc(10);
        pVVar6 = Vec_PtrAlloc(pNtk1->vPos->nSize * 2);
        for (lVar12 = 0; lVar12 < *oLastItem1; lVar12 = lVar12 + 1) {
          if (1 < oMatch1[lVar12]->nSize) {
            iVar1 = Vec_IntFind(oMatchedGroups,(int)lVar12);
            if (iVar1 == -1) {
              Vec_IntPush(pVVar8,(int)lVar12);
            }
          }
        }
        subNtk1 = computeCofactor(pNtk1,nodesInLevel1,(int *)0x0,matchedInputs1);
        subNtk2 = computeCofactor(pNtk2,nodesInLevel2,(int *)0x0,matchedInputs2);
        iVar1 = matchNonSingletonOutputs
                          (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                           pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup1,oMatch2,oGroup2,
                           matchedOutputs1,matchedOutputs2,oMatchedGroups,(Vec_Int_t *)0x0,subNtk1,
                           subNtk2,pVVar6,pVVar8,0,0,0,0);
        Vec_IntFree(pVVar8);
        Vec_PtrFree(pVVar6);
        Abc_NtkDelete(subNtk1);
        Abc_NtkDelete(subNtk2);
        bVar13 = iVar1 == 0;
      }
      aVar9 = Abc_Clock();
      if (!bVar13) {
        checkEquivalence(pNtk1,matchedInputs1,matchedOutputs1,pNtk2,matchedInputs2,matchedOutputs2);
        __stream = fopen("IOmatch.txt","w");
        fprintf(__stream,"I/O = %d / %d \n\n",(ulong)(uint)pNtk1->vPis->nSize,
                (ulong)(uint)pNtk1->vPos->nSize);
        iVar1 = matchedInputs1->nSize;
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
          iVar4 = Vec_IntEntry(matchedInputs1,iVar2);
          pAVar7 = Abc_NtkPi(pNtk1,iVar4);
          pcVar10 = Abc_ObjName(pAVar7);
          iVar4 = Vec_IntEntry(matchedInputs2,iVar2);
          pAVar7 = Abc_NtkPi(pNtk2,iVar4);
          pcVar11 = Abc_ObjName(pAVar7);
          fprintf(__stream,"{%s}\t{%s}\n",pcVar10,pcVar11);
        }
        fwrite("\n-----------------------------------------\n",0x2b,1,__stream);
        iVar1 = matchedOutputs1->nSize;
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
          iVar4 = Vec_IntEntry(matchedOutputs1,iVar2);
          pAVar7 = Abc_NtkPo(pNtk1,iVar4);
          pcVar10 = Abc_ObjName(pAVar7);
          iVar4 = Vec_IntEntry(matchedOutputs2,iVar2);
          pAVar7 = Abc_NtkPo(pNtk2,iVar4);
          pcVar11 = Abc_ObjName(pAVar7);
          fprintf(__stream,"{%s}\t{%s}\n",pcVar10,pcVar11);
        }
        fclose(__stream);
      }
      Vec_IntFree(matchedInputs1);
      Vec_IntFree(matchedInputs2);
      Vec_IntFree(matchedOutputs1);
      Vec_IntFree(matchedOutputs2);
      Vec_IntFree(iNonSingleton);
      Vec_IntFree(oMatchedGroups);
      for (lVar12 = 0; iVar1 = Abc_AigLevel(pNtk1), lVar12 <= iVar1; lVar12 = lVar12 + 1) {
        Vec_PtrFree(nodesInLevel1[lVar12]);
      }
      for (lVar12 = 0; iVar1 = Abc_AigLevel(pNtk2), lVar12 <= iVar1; lVar12 = lVar12 + 1) {
        Vec_PtrFree(nodesInLevel2[lVar12]);
      }
      free(nodesInLevel1);
      free(nodesInLevel2);
      return (float)(aVar9 - aVar5) / 1e+06;
    }
    for (i = iVar4 + 1; iVar2 = iVar4 + 1, i < iVar1; i = i + 1) {
      iVar2 = Vec_IntEntry(iNonSingleton,i);
      iVar2 = Vec_IntEntry(iMatch2[iVar2],0);
      iVar2 = observability2[iVar2];
      iVar3 = Vec_IntEntry(iNonSingleton,iVar4);
      iVar3 = Vec_IntEntry(iMatch2[iVar3],0);
      if (observability2[iVar3] < iVar2) {
LAB_00267cd3:
        iVar2 = Vec_IntEntry(iNonSingleton,iVar4);
        iVar3 = Vec_IntEntry(iNonSingleton,i);
        Vec_IntWriteEntry(iNonSingleton,iVar4,iVar3);
        Vec_IntWriteEntry(iNonSingleton,i,iVar2);
      }
      else {
        iVar2 = Vec_IntEntry(iNonSingleton,i);
        iVar2 = Vec_IntEntry(iMatch2[iVar2],0);
        iVar2 = observability2[iVar2];
        iVar3 = Vec_IntEntry(iNonSingleton,iVar4);
        iVar3 = Vec_IntEntry(iMatch2[iVar3],0);
        if (iVar2 == observability2[iVar3]) {
          iVar2 = Vec_IntEntry(iNonSingleton,i);
          iVar2 = iMatch2[iVar2]->nSize;
          iVar3 = Vec_IntEntry(iNonSingleton,iVar4);
          if (iVar2 < iMatch2[iVar3]->nSize) goto LAB_00267cd3;
        }
      }
    }
  } while( true );
}

Assistant:

float refineBySAT(Abc_Ntk_t * pNtk1, Vec_Int_t ** iMatch1, int * iGroup1, Vec_Int_t ** iDep1, int* iLastItem1, Vec_Int_t ** oMatch1, int * oGroup1, Vec_Int_t ** oDep1, int* oLastItem1, int * observability1,
                 Abc_Ntk_t * pNtk2, Vec_Int_t ** iMatch2, int * iGroup2, Vec_Int_t ** iDep2, int* iLastItem2, Vec_Int_t ** oMatch2, int * oGroup2, Vec_Int_t ** oDep2, int* oLastItem2, int * observability2)
{
    int i, j;    
    Abc_Obj_t * pObj;
    Vec_Int_t * iNonSingleton;
    Vec_Int_t * matchedInputs1, * matchedInputs2;
    Vec_Int_t * matchedOutputs1, * matchedOutputs2;
    Vec_Ptr_t ** nodesInLevel1, ** nodesInLevel2;
    Vec_Int_t * oMatchedGroups;
    FILE *result;    
    int matchFound;
    abctime clk = Abc_Clock();
    float satTime = 0.0;

    /*matchFile = fopen("satmatch.txt", "w");*/
    
    iNonSingleton = Vec_IntAlloc(10);    
    
    matchedInputs1 = Vec_IntAlloc( Abc_NtkPiNum(pNtk1) );
    matchedInputs2 = Vec_IntAlloc( Abc_NtkPiNum(pNtk2) );

    matchedOutputs1 = Vec_IntAlloc( Abc_NtkPoNum(pNtk1) );
    matchedOutputs2 = Vec_IntAlloc( Abc_NtkPoNum(pNtk2) );

    nodesInLevel1 = ABC_ALLOC( Vec_Ptr_t *, Abc_AigLevel( pNtk1 ) + 1);    // why numOfLevels+1? because the inputs are in level 0
    for(i = 0; i <= Abc_AigLevel( pNtk1 ); i++)
        nodesInLevel1[i] = Vec_PtrAlloc( 20 );

    // bucket sort the objects based on their levels
    Abc_AigForEachAnd( pNtk1, pObj, i )    
        Vec_PtrPush(nodesInLevel1[Abc_ObjLevel(pObj)], pObj);
    
    nodesInLevel2 = ABC_ALLOC( Vec_Ptr_t *, Abc_AigLevel( pNtk2 ) + 1);    // why numOfLevels+1? because the inputs are in level 0
    for(i = 0; i <= Abc_AigLevel( pNtk2 ); i++)
        nodesInLevel2[i] = Vec_PtrAlloc( 20 );

    // bucket sort the objects based on their levels
    Abc_AigForEachAnd( pNtk2, pObj, i )    
        Vec_PtrPush(nodesInLevel2[Abc_ObjLevel(pObj)], pObj);    

    oMatchedGroups = Vec_IntAlloc( 10 );

    for(i = 0; i < *iLastItem1; i++)
    {
        if(Vec_IntSize(iMatch1[i]) == 1)
        {
            Vec_IntPush(matchedInputs1, Vec_IntEntryLast(iMatch1[i]));
            Vec_IntPush(matchedInputs2, Vec_IntEntryLast(iMatch2[i]));        
        }
        else
            Vec_IntPush(iNonSingleton, i);
    }

    for(i = 0; i < *oLastItem1; i++)
    {
        if(Vec_IntSize(oMatch1[i]) == 1)
        {
            Vec_IntPush(matchedOutputs1, Vec_IntEntryLast(oMatch1[i]));
            Vec_IntPush(matchedOutputs2, Vec_IntEntryLast(oMatch2[i]));
        }
    }
    
    for(i = 0; i < Vec_IntSize(iNonSingleton) - 1; i++)
    {
        for(j = i + 1; j < Vec_IntSize(iNonSingleton); j++)        
            if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] > 
                observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
            {                
                int temp = Vec_IntEntry(iNonSingleton, i);
                Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                Vec_IntWriteEntry( iNonSingleton, j, temp );                
            }
            else if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] == 
                     observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
            {
                if( Vec_IntSize(iMatch2[Vec_IntEntry(iNonSingleton, j)]) < Vec_IntSize(iMatch2[Vec_IntEntry(iNonSingleton, i)]) )
                {
                    int temp = Vec_IntEntry(iNonSingleton, i);
                    Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                    Vec_IntWriteEntry( iNonSingleton, j, temp );                
                }
            }
    }    

    /*for(i = 0; i < Vec_IntSize(iNonSingleton) - 1; i++)
    {
        for(j = i + 1; j < Vec_IntSize(iNonSingleton); j++)        
            if( Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, j)])]]) > 
                Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, i)])]]) )
            {                
                int temp = Vec_IntEntry(iNonSingleton, i);
                Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                Vec_IntWriteEntry( iNonSingleton, j, temp );                
            }
            else if( Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, j)])]]) == 
                Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, i)])]]) )
            {
                if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] > 
                        observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
                {
                    int temp = Vec_IntEntry(iNonSingleton, i);
                    Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                    Vec_IntWriteEntry( iNonSingleton, j, temp );                
                }
            }
    }*/

    matchFound = match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                           pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                           matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, 0, 0);

    if( matchFound && Vec_IntSize(matchedOutputs1) != Abc_NtkPoNum(pNtk1) )
    {
        Vec_Int_t * oNonSingleton;
        Vec_Ptr_t * oMatchPairs;
        Abc_Ntk_t * subNtk1, * subNtk2;

        oNonSingleton = Vec_IntAlloc( 10 );
        
        oMatchPairs = Vec_PtrAlloc(Abc_NtkPoNum(pNtk1) * 2);    

        for(i = 0; i < *oLastItem1; i++)
            if( Vec_IntSize(oMatch1[i]) > 1 && Vec_IntFind( oMatchedGroups, i) == -1 )
                Vec_IntPush(oNonSingleton, i);
            
        subNtk1 = computeCofactor(pNtk1, nodesInLevel1, NULL, matchedInputs1);
        subNtk2 = computeCofactor(pNtk2, nodesInLevel2, NULL, matchedInputs2);
        
        matchFound = matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                 pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup1, oMatch2, oGroup2,
                                 matchedOutputs1, matchedOutputs2, oMatchedGroups, NULL,                         
                                 subNtk1, subNtk2, oMatchPairs, oNonSingleton, 0, 0, 0, 0);

        Vec_IntFree( oNonSingleton );        
        Vec_PtrFree( oMatchPairs );

        Abc_NtkDelete(subNtk1);
        Abc_NtkDelete(subNtk2);
    }

    satTime = (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC);    

    if( matchFound )
    {
          checkEquivalence( pNtk1, matchedInputs1, matchedOutputs1, pNtk2, matchedInputs2, matchedOutputs2);

        result = fopen("IOmatch.txt", "w");

        fprintf(result, "I/O = %d / %d \n\n", Abc_NtkPiNum(pNtk1), Abc_NtkPoNum(pNtk1));
        
        for(i = 0; i < Vec_IntSize(matchedInputs1) ; i++)
              fprintf(result, "{%s}\t{%s}\n", Abc_ObjName(Abc_NtkPi(pNtk1, Vec_IntEntry(matchedInputs1, i))), Abc_ObjName(Abc_NtkPi(pNtk2, Vec_IntEntry(matchedInputs2, i))) );                                    

        fprintf(result, "\n-----------------------------------------\n");

        for(i = 0; i < Vec_IntSize(matchedOutputs1) ; i++)
            fprintf(result, "{%s}\t{%s}\n", Abc_ObjName(Abc_NtkPo(pNtk1, Vec_IntEntry(matchedOutputs1, i))), Abc_ObjName(Abc_NtkPo(pNtk2, Vec_IntEntry(matchedOutputs2, i))) );                                    

        fclose( result );    
    }

    Vec_IntFree( matchedInputs1 );
    Vec_IntFree( matchedInputs2 );
    Vec_IntFree( matchedOutputs1 );
    Vec_IntFree( matchedOutputs2 );
    Vec_IntFree( iNonSingleton );
    Vec_IntFree( oMatchedGroups );
    
    for(i = 0; i <= Abc_AigLevel( pNtk1 ); i++)    
        Vec_PtrFree( nodesInLevel1[i] );
    for(i = 0; i <= Abc_AigLevel( pNtk2 ); i++)    
        Vec_PtrFree( nodesInLevel2[i] );
    

    ABC_FREE( nodesInLevel1 );
    ABC_FREE( nodesInLevel2 );
    /*fclose(matchFile);*/
    
    return satTime;
}